

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O2

learner<svm_params,_example> *
LEARNER::init_learner<svm_params,example,LEARNER::learner<char,example>>
          (free_ptr<svm_params> *dat,
          _func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr *learn,
          _func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr *predict,
          size_t params_per_weight)

{
  learner<svm_params,_example> *plVar1;
  
  plVar1 = learner<svm_params,example>::init_learner<LEARNER::learner<char,example>>
                     ((dat->_M_t).super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_svm_params_*,_false>._M_head_impl,
                      (learner<char,_example> *)0x0,learn,predict,params_per_weight,scalar);
  (dat->_M_t).super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.super__Head_base<0UL,_svm_params_*,_false>.
  _M_head_impl = (svm_params *)0x0;
  return plVar1;
}

Assistant:

learner<T, E>& init_learner(
    free_ptr<T>& dat, void (*learn)(T&, L&, E&), void (*predict)(T&, L&, E&), size_t params_per_weight)
{
  auto ret =
      &learner<T, E>::init_learner(dat.get(), (L*)nullptr, learn, predict, params_per_weight, prediction_type::scalar);

  dat.release();
  return *ret;
}